

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_7::NameApplier::UseNameForVar(NameApplier *this,string_view name,Var *var)

{
  string_view y;
  bool bVar1;
  string *psVar2;
  Var *this_00;
  string_view name_00;
  string_view x;
  
  this_00 = (Var *)name.size_;
  x.size_ = name.data_;
  if (this_00->type_ == Name) {
    psVar2 = Var::name_abi_cxx11_(this_00);
    y.data_ = (psVar2->_M_dataplus)._M_p;
    y.size_ = psVar2->_M_string_length;
    x.data_ = (char *)this;
    bVar1 = wabt::operator==(x,y);
    if (!bVar1) {
      __assert_fail("name == var->name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/apply-names.cc"
                    ,0x7a,
                    "void wabt::(anonymous namespace)::NameApplier::UseNameForVar(string_view, Var *)"
                   );
    }
  }
  else if (x.size_ != (char *)0x0) {
    name_00.size_ = (size_type)x.size_;
    name_00.data_ = (char *)this;
    Var::set_name(this_00,name_00);
    return;
  }
  return;
}

Assistant:

void NameApplier::UseNameForVar(string_view name, Var* var) {
  if (var->is_name()) {
    assert(name == var->name());
    return;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
}